

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O3

bool __thiscall MemoryManager::setByteNoCache(MemoryManager *this,uint32_t addr,uint8_t val)

{
  long lVar1;
  bool bVar2;
  
  if ((this->memory[addr >> 0x16] == (uint8_t **)0x0) ||
     (lVar1 = *(long *)((long)this->memory[addr >> 0x16] + (ulong)(addr >> 9 & 0x1ff8)), lVar1 == 0)
     ) {
    bVar2 = false;
    dbgprintf("Byte write to invalid addr 0x%x!\n");
  }
  else {
    *(uint8_t *)(lVar1 + (ulong)(addr & 0xfff)) = val;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool MemoryManager::setByteNoCache(uint32_t addr, uint8_t val) {
  if (!this->isAddrExist(addr)) {
    dbgprintf("Byte write to invalid addr 0x%x!\n", addr);
    return false;
  }

  uint32_t i = this->getFirstEntryId(addr);
  uint32_t j = this->getSecondEntryId(addr);
  uint32_t k = this->getPageOffset(addr);
  this->memory[i][j][k] = val;
  return true;
}